

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCodeMetadataExpr
          (ExprVisitorDelegate *this,CodeMetadataExpr *expr)

{
  pointer data;
  
  WriteOpen(this->writer_,"@metadata.code.",None);
  WriteDataWithNextChar(this->writer_,(expr->name)._M_str,(expr->name)._M_len);
  WritePutc(this->writer_,' ');
  data = (expr->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  WriteQuotedData(this->writer_,data,
                  (long)(expr->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)data);
  WriteCloseSpace(this->writer_);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCodeMetadataExpr(
    CodeMetadataExpr* expr) {
  writer_->WriteOpen("@metadata.code.", NextChar::None);
  writer_->WriteDataWithNextChar(expr->name.data(), expr->name.size());
  writer_->WritePutc(' ');
  writer_->WriteQuotedData(expr->data.data(), expr->data.size());
  writer_->WriteCloseSpace();
  return Result::Ok;
}